

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O3

size_t util::findLast(string *in,char c)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = std::__cxx11::string::find((char)in,0x5f);
  do {
    sVar2 = sVar1;
    if (sVar2 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar1 = std::__cxx11::string::find((char)in,(ulong)(uint)(int)c);
  } while (sVar1 != 0xffffffffffffffff);
  return sVar2;
}

Assistant:

size_t findLast(const std::string& in, char c) {
  auto pos = in.find('_');
  while (pos != std::string::npos) {
    auto npos = in.find(c, pos + 1);
    if (npos == std::string::npos) {
      break;
    }
    pos = npos;
  }
  return pos;
}